

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_ai::save(xr_level_ai *this,xr_writer *w)

{
  ulong uVar1;
  long lVar2;
  ai_node *p;
  ai_node *node;
  write_node_v10 local_24 [4];
  
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,local_24,4);
  (*w->_vptr_xr_writer[2])(w,&this->m_aabb,0x18);
  xr_guid::save(&this->m_guid,w);
  uVar1 = (ulong)this->m_num_nodes;
  node = this->m_nodes;
  if (this->m_version < 10) {
    if (uVar1 != 0) {
      lVar2 = uVar1 * 0x1c;
      do {
        write_node_v8::operator()((write_node_v8 *)local_24,node,w);
        node = node + 1;
        lVar2 = lVar2 + -0x1c;
      } while (lVar2 != 0);
    }
  }
  else if (uVar1 != 0) {
    lVar2 = uVar1 * 0x1c;
    do {
      write_node_v10::operator()(local_24,node,w);
      node = node + 1;
      lVar2 = lVar2 + -0x1c;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void xr_level_ai::save(xr_writer& w) const
{
	w.w_u32(m_version);
	w.w_u32(m_num_nodes);
	w.w_float(m_size);
	w.w_float(m_size_y);
	w.w(m_aabb);
	m_guid.save(w);
	if (m_version >= AI_VERSION_10)
		w.w_cseq(m_num_nodes, m_nodes, write_node_v10());
	else
		w.w_cseq(m_num_nodes, m_nodes, write_node_v8());
}